

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::leaf_node<int,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<int,true>>::operator=
          (ref<immutable::rrb_details::leaf_node<int,true>> *this,
          ref<immutable::rrb_details::internal_node<int,_true>_> *r)

{
  internal_node<int,_true> *piVar1;
  leaf_node<int,_true> *p_node;
  
  piVar1 = r->ptr;
  if (piVar1 != (internal_node<int,_true> *)0x0) {
    LOCK();
    (piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  p_node = *(leaf_node<int,_true> **)this;
  *(internal_node<int,_true> **)this = piVar1;
  rrb_details::release<int>(p_node);
  return (ref<immutable::rrb_details::leaf_node<int,_true>_> *)this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }